

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O3

bool __thiscall Client::conn_svr(Client *this)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  sockaddr local_28;
  
  iVar2 = socket(2,1,0);
  if (iVar2 < 0) {
    conn_svr();
    bVar4 = false;
  }
  else {
    this->_sock_fd = iVar2;
    local_28.sa_data[6] = '\0';
    local_28.sa_data[7] = '\0';
    local_28.sa_data[8] = '\0';
    local_28.sa_data[9] = '\0';
    local_28.sa_data[10] = '\0';
    local_28.sa_data[0xb] = '\0';
    local_28.sa_data[0xc] = '\0';
    local_28.sa_data[0xd] = '\0';
    local_28.sa_family = 2;
    local_28.sa_data._2_4_ = inet_addr((this->_svr_ip)._M_dataplus._M_p);
    uVar1 = (ushort)this->_svr_port;
    local_28.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
    iVar2 = connect(this->_sock_fd,&local_28,0x10);
    bVar4 = iVar2 >= 0;
    if (iVar2 < 0) {
      conn_svr();
    }
    else {
      uVar3 = fcntl(this->_sock_fd,3,0);
      fcntl(this->_sock_fd,4,(ulong)(uVar3 | 0x800));
      uVar3 = fcntl(0,3,0);
      fcntl(0,4,(ulong)(uVar3 | 0x800));
      uVar3 = fcntl(1,3,0);
      fcntl(1,4,(ulong)(uVar3 | 0x800));
      Epoll::create_epool(&this->_epoll,4);
    }
  }
  return bVar4;
}

Assistant:

bool Client::conn_svr()
{
    int sock_fd;
    
    if ((sock_fd = socket(AF_INET, SOCK_STREAM, 0)) < 0)
    {
        LOG_PRINT("client sock creation failed, status %s", strerror(errno));
        return false;
    }
    _sock_fd = sock_fd;

    struct sockaddr_in client_addr;

    bzero(&client_addr, sizeof(client_addr));
    client_addr.sin_family = AF_INET;
    client_addr.sin_addr.s_addr = inet_addr(_svr_ip.c_str());
    client_addr.sin_port = htons(_svr_port);

    if (connect(_sock_fd, (struct sockaddr *)&client_addr, sizeof(struct sockaddr)) < 0)
    {
        LOG_PRINT("connect to server[%s:%d] failed", _svr_ip.c_str(), _svr_port);
        return false;
    }

    int flags = fcntl(_sock_fd, F_GETFL, 0);
    fcntl(_sock_fd, F_SETFL, flags | O_NONBLOCK);

    flags = fcntl(STDIN_FILENO, F_GETFL, 0);
    fcntl(STDIN_FILENO, F_SETFL, flags | O_NONBLOCK);

    flags = fcntl(STDOUT_FILENO, F_GETFL, 0);
    fcntl(STDOUT_FILENO, F_SETFL, flags | O_NONBLOCK);

    _epoll.create_epool(kMax_conn_size);

    return true;
}